

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void template_setsymbol(t_template *x,t_symbol *fieldname,t_word *wp,t_symbol *s,int loud)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *fmt;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_38;
  int local_34;
  t_symbol *local_30;
  
  iVar1 = template_find_field(x,fieldname,&local_34,&local_38,&local_30);
  if (iVar1 == 0) {
    if (loud != 0) {
      pcVar3 = x->t_sym->s_name;
      pcVar2 = fieldname->s_name;
      fmt = "%s.%s: no such field";
LAB_001583a2:
      pd_error((void *)0x0,fmt,pcVar3,pcVar2);
      return;
    }
  }
  else if (local_38 == 1) {
    *(t_symbol **)((long)wp + (long)local_34) = s;
  }
  else if (loud != 0) {
    pcVar3 = x->t_sym->s_name;
    pcVar2 = fieldname->s_name;
    fmt = "%s.%s: not a symbol";
    goto LAB_001583a2;
  }
  return;
}

Assistant:

void template_setsymbol(t_template *x, t_symbol *fieldname, t_word *wp,
    t_symbol *s, int loud)
{
    int onset, type;
    t_symbol *arraytype;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
     {
        if (type == DT_SYMBOL)
            *(t_symbol **)(((char *)wp) + onset) = s;
        else if (loud) pd_error(0, "%s.%s: not a symbol",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
}